

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_inflateEnd(mz_streamp pStream)

{
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    if (*(long *)(in_RDI + 0x38) != 0) {
      (**(code **)(in_RDI + 0x48))(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x38));
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mz_inflateEnd(mz_streamp pStream) {
  if (!pStream)
    return MZ_STREAM_ERROR;
  if (pStream->state) {
    pStream->zfree(pStream->opaque, pStream->state);
    pStream->state = NULL;
  }
  return MZ_OK;
}